

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionSystemData::unmarshal
          (ElectromagneticEmissionSystemData *this,DataStream *dataStream)

{
  ulong uVar1;
  ElectromagneticEmissionBeamData x;
  ElectromagneticEmissionBeamData EStack_a8;
  
  DataStream::operator>>(dataStream,&this->_systemDataLength);
  DataStream::operator>>(dataStream,&this->_numberOfBeams);
  DataStream::operator>>(dataStream,&this->_emissionsPadding2);
  EmitterSystem::unmarshal(&this->_emitterSystem,dataStream);
  Vector3Float::unmarshal(&this->_location,dataStream);
  std::
  vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
  ::clear(&this->_beamDataRecords);
  for (uVar1 = 0; uVar1 < this->_numberOfBeams; uVar1 = uVar1 + 1) {
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData(&EStack_a8);
    ElectromagneticEmissionBeamData::unmarshal(&EStack_a8,dataStream);
    std::
    vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
    ::push_back(&this->_beamDataRecords,&EStack_a8);
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&EStack_a8);
  }
  return;
}

Assistant:

void ElectromagneticEmissionSystemData::unmarshal(DataStream& dataStream)
{
    dataStream >> _systemDataLength;
    dataStream >> _numberOfBeams;
    dataStream >> _emissionsPadding2;
    _emitterSystem.unmarshal(dataStream);
    _location.unmarshal(dataStream);

    _beamDataRecords.clear();
    for(size_t idx = 0; idx < _numberOfBeams; idx++)
    {
        ElectromagneticEmissionBeamData x;
        x.unmarshal(dataStream);
        _beamDataRecords.push_back(x);
    }
}